

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* httplib::make_basic_authentication_header
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *username,string *password,bool is_proxy)

{
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  char *local_c0;
  char *key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field;
  bool is_proxy_local;
  string *password_local;
  string *username_local;
  
  field.field_2._M_local_buf[0xf] = is_proxy;
  std::operator+(&local_a8,username,":");
  std::operator+(&local_88,&local_a8,password);
  detail::base64_encode(&local_68,&local_88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 "Basic ",&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  local_c0 = "Authorization";
  if ((field.field_2._M_local_buf[0xf] & 1U) != 0) {
    local_c0 = "Proxy-Authorization";
  }
  std::make_pair<char_const*&,std::__cxx11::string>
            (&local_e8,&local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,&local_e8);
  std::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_e8);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string, std::string>
	make_basic_authentication_header(const std::string &username,
									 const std::string &password,
									 bool is_proxy = false) {
		auto field = "Basic " + detail::base64_encode(username + ":" + password);
		auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
		return std::make_pair(key, std::move(field));
	}